

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zesDeviceGetEccState(zes_device_handle_t hDevice,zes_device_ecc_properties_t *pState)

{
  ze_result_t zVar1;
  
  if (DAT_0010da60 != (code *)0x0) {
    zVar1 = (*DAT_0010da60)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetEccState(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetEccState = context.zesDdiTable.Device.pfnGetEccState;
        if( nullptr != pfnGetEccState )
        {
            result = pfnGetEccState( hDevice, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }